

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::deleteRows(HighsSparseMatrix *this,HighsIndexCollection *index_collection)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  HighsInt row;
  long lVar4;
  HighsInt el;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  HighsInt keep_to_row;
  HighsInt current_set_entry;
  HighsInt delete_from_row;
  HighsInt from_k;
  HighsInt keep_from_row;
  HighsInt delete_to_row;
  HighsInt to_k;
  vector<int,_std::allocator<int>_> new_index;
  HighsInt local_64 [2];
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  limits(index_collection,&local_58,&local_4c);
  if (local_58 <= local_4c) {
    iVar8 = this->num_row_;
    local_64[0] = -1;
    local_64[1] = 0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_48,(long)iVar8);
    if (index_collection->is_mask_ == true) {
      piVar1 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      for (lVar4 = 0; lVar4 < this->num_row_; lVar4 = lVar4 + 1) {
        iVar8 = piVar1[lVar4];
        uVar6 = -(uint)(iVar8 != 0) | uVar9;
        uVar9 = uVar9 + (iVar8 == 0);
        local_48._M_impl.super__Vector_impl_data._M_start[lVar4] = uVar6;
      }
    }
    else {
      local_64[0] = -1;
      local_64[1] = 0;
      uVar9 = 0;
      iVar7 = local_58;
      do {
        if (local_4c < iVar7) break;
        updateOutInIndex(index_collection,&local_5c,&local_50,&local_54,local_64,local_64 + 1);
        if (iVar7 == local_58) {
          for (lVar4 = 0; lVar4 < local_5c; lVar4 = lVar4 + 1) {
            local_48._M_impl.super__Vector_impl_data._M_start[lVar4] = uVar9 + (int)lVar4;
          }
          uVar9 = uVar9 + (int)lVar4;
        }
        for (lVar4 = (long)local_5c; lVar4 <= local_50; lVar4 = lVar4 + 1) {
          local_48._M_impl.super__Vector_impl_data._M_start[lVar4] = -1;
        }
        for (lVar4 = (long)local_54; lVar4 <= local_64[0]; lVar4 = lVar4 + 1) {
          local_48._M_impl.super__Vector_impl_data._M_start[lVar4] = uVar9;
          uVar9 = uVar9 + 1;
        }
        iVar7 = iVar7 + 1;
      } while (local_64[0] < iVar8 + -1);
    }
    piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    iVar8 = 0;
    while (lVar4 < this->num_col_) {
      iVar7 = piVar1[lVar4];
      piVar1[lVar4] = iVar8;
      lVar4 = lVar4 + 1;
      piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar5 = (long)iVar7; lVar5 < piVar1[lVar4]; lVar5 = lVar5 + 1) {
        if (-1 < local_48._M_impl.super__Vector_impl_data._M_start[piVar2[lVar5]]) {
          piVar2[iVar8] = local_48._M_impl.super__Vector_impl_data._M_start[piVar2[lVar5]];
          pdVar3[iVar8] = pdVar3[lVar5];
          iVar8 = iVar8 + 1;
        }
      }
    }
    piVar1[this->num_col_] = iVar8;
    std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)this->num_col_ + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar8);
    std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar8);
    this->num_row_ = uVar9;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void HighsSparseMatrix::deleteRows(
    const HighsIndexCollection& index_collection) {
  assert(this->formatOk());
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt row_dim = this->num_row_;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  // Set up a row mask to indicate the new row index of kept rows and
  // -1 for deleted rows so that the kept entries in the column-wise
  // matrix can be identified and have their correct row index.
  vector<HighsInt> new_index;
  new_index.resize(this->num_row_);
  HighsInt new_num_row = 0;
  bool mask = index_collection.is_mask_;
  const vector<HighsInt>& row_mask = index_collection.mask_;
  if (!mask) {
    keep_to_row = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                       keep_from_row, keep_to_row, current_set_entry);
      if (k == from_k) {
        // Account for any initial rows being kept
        for (HighsInt row = 0; row < delete_from_row; row++) {
          new_index[row] = new_num_row;
          new_num_row++;
        }
      }
      for (HighsInt row = delete_from_row; row <= delete_to_row; row++) {
        new_index[row] = -1;
      }
      for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
        new_index[row] = new_num_row;
        new_num_row++;
      }
      if (keep_to_row >= row_dim - 1) break;
    }
  } else {
    for (HighsInt row = 0; row < this->num_row_; row++) {
      if (row_mask[row]) {
        new_index[row] = -1;
      } else {
        new_index[row] = new_num_row;
        new_num_row++;
      }
    }
  }
  HighsInt new_num_nz = 0;
  for (HighsInt col = 0; col < this->num_col_; col++) {
    HighsInt from_el = this->start_[col];
    this->start_[col] = new_num_nz;
    for (HighsInt el = from_el; el < this->start_[col + 1]; el++) {
      HighsInt row = this->index_[el];
      HighsInt new_row = new_index[row];
      if (new_row >= 0) {
        this->index_[new_num_nz] = new_row;
        this->value_[new_num_nz] = this->value_[el];
        new_num_nz++;
      }
    }
  }
  this->start_[this->num_col_] = new_num_nz;
  this->start_.resize(this->num_col_ + 1);
  this->index_.resize(new_num_nz);
  this->value_.resize(new_num_nz);
  // Update the number of rows
  this->num_row_ = new_num_row;
}